

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanValue(Scanner *this)

{
  bool bVar1;
  ParserException *this_00;
  Stream *in_RDI;
  Mark mark;
  bool isSimpleKey;
  undefined8 in_stack_fffffffffffffef8;
  int n;
  Stream *__x;
  Stream *in_stack_ffffffffffffff00;
  Token *this_01;
  undefined8 in_stack_ffffffffffffff08;
  Mark *mark_;
  TYPE type_;
  Token *in_stack_ffffffffffffff10;
  Scanner *in_stack_ffffffffffffff38;
  INDENT_TYPE in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Scanner *in_stack_ffffffffffffff78;
  undefined1 local_59 [33];
  Mark local_38;
  Mark local_18;
  undefined1 local_9;
  
  type_ = (TYPE)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  n = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_9 = VerifySimpleKey(in_stack_ffffffffffffff38);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  if ((bool)local_9) {
    in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 0;
  }
  else {
    bVar1 = InBlockContext((Scanner *)0xf20b7e);
    if (bVar1) {
      if ((in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a &
          1) == 0) {
        this_00 = (ParserException *)__cxa_allocate_exception(0x40);
        local_38 = YAML::Stream::mark(in_RDI);
        mark_ = (Mark *)local_59;
        local_18 = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_59 + 1),"illegal map value",(allocator *)mark_);
        ParserException::ParserException(this_00,mark_,(string *)in_stack_ffffffffffffff00);
        __cxa_throw(this_00,&ParserException::typeinfo,ParserException::~ParserException);
      }
      YAML::Stream::column(in_RDI);
      PushIndentTo(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
    }
    bVar1 = InBlockContext((Scanner *)0xf20d00);
    in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = bVar1;
  }
  YAML::Stream::mark(in_RDI);
  YAML::Stream::eat(in_stack_ffffffffffffff00,n);
  __x = in_RDI + 1;
  this_01 = (Token *)&stack0xffffffffffffff30;
  Token::Token(in_stack_ffffffffffffff10,type_,(Mark *)this_01);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)this_01,
             (value_type *)__x);
  Token::~Token(this_01);
  return;
}

Assistant:

void Scanner::ScanValue() {
  // and check that simple key
  bool isSimpleKey = VerifySimpleKey();
  m_canBeJSONFlow = false;

  if (isSimpleKey) {
    // can't follow a simple key with another simple key (dunno why, though - it
    // seems fine)
    m_simpleKeyAllowed = false;
  } else {
    // handle values differently in the block context (and manage indents)
    if (InBlockContext()) {
      if (!m_simpleKeyAllowed)
        throw ParserException(INPUT.mark(), ErrorMsg::MAP_VALUE);

      PushIndentTo(INPUT.column(), IndentMarker::MAP);
    }

    // can only put a simple key here if we're in block context
    m_simpleKeyAllowed = InBlockContext();
  }

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::VALUE, mark));
}